

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic-capability.c++
# Opt level: O2

DispatchCallResult __thiscall
capnp::DynamicCapability::Server::dispatchCall
          (Server *this,uint64_t interfaceId,uint16_t methodId,
          CallContext<capnp::AnyPointer,_capnp::AnyPointer> context)

{
  bool bVar1;
  undefined8 extraout_RDX;
  undefined8 uVar2;
  uint index;
  Reader RVar3;
  DispatchCallResult DVar4;
  StructSchema resultType;
  NullableValue<capnp::InterfaceSchema> _interface61;
  Method method;
  MethodList methods;
  Schema local_c0;
  char local_b8;
  Schema local_b0;
  undefined1 local_a8 [64];
  MethodList local_68;
  
  InterfaceSchema::findSuperclass((InterfaceSchema *)local_a8,interfaceId + 0x10);
  local_b8 = local_a8[0];
  if (local_a8[0] == '\x01') {
    local_b0.raw = (RawBrandedSchema *)local_a8._8_8_;
    InterfaceSchema::getMethods(&local_68,(InterfaceSchema *)&local_b0);
    index = (uint)context.hook & 0xffff;
    if (index < local_68.list.reader.elementCount) {
      InterfaceSchema::MethodList::operator[]((Method *)local_a8,&local_68,index);
      local_c0.raw = (RawBrandedSchema *)InterfaceSchema::Method::getResultType((Method *)local_a8);
      InterfaceSchema::Method::getParamType((Method *)local_a8);
      (**(code **)(*(long *)interfaceId + 0x18))(this,interfaceId);
      bVar1 = StructSchema::isStreamResult((StructSchema *)&local_c0);
      *(bool *)&(this->super_Server).thisHook.ptr = bVar1;
      *(undefined1 *)((long)&(this->super_Server).thisHook.ptr + 1) =
           *(undefined1 *)(interfaceId + 0x18);
      uVar2 = extraout_RDX;
    }
    else {
      Schema::getProto((Reader *)local_a8,&local_b0);
      RVar3 = capnp::schema::Node::Reader::getDisplayName((Reader *)local_a8);
      DVar4 = Capability::Server::internalUnimplemented
                        (&this->super_Server,(char *)interfaceId,
                         (uint64_t)RVar3.super_StringPtr.content.ptr,methodId);
      uVar2 = DVar4._8_8_;
    }
  }
  else {
    Schema::getProto((Reader *)local_a8,(Schema *)(interfaceId + 0x10));
    RVar3 = capnp::schema::Node::Reader::getDisplayName((Reader *)local_a8);
    DVar4 = Capability::Server::internalUnimplemented
                      (&this->super_Server,(char *)interfaceId,
                       (uint64_t)RVar3.super_StringPtr.content.ptr);
    uVar2 = DVar4._8_8_;
  }
  DVar4.isStreaming = (bool)(char)uVar2;
  DVar4.allowCancellation = (bool)(char)((ulong)uVar2 >> 8);
  DVar4._10_6_ = (int6)((ulong)uVar2 >> 0x10);
  DVar4.promise.super_PromiseBase.node.ptr = (PromiseBase)(PromiseBase)this;
  return DVar4;
}

Assistant:

Capability::Server::DispatchCallResult DynamicCapability::Server::dispatchCall(
    uint64_t interfaceId, uint16_t methodId,
    CallContext<AnyPointer, AnyPointer> context) {
  KJ_IF_SOME(interface, schema.findSuperclass(interfaceId)) {
    auto methods = interface.getMethods();
    if (methodId < methods.size()) {
      auto method = methods[methodId];
      auto resultType = method.getResultType();
      return {
        call(method, CallContext<DynamicStruct, DynamicStruct>(*context.hook,
            method.getParamType(), resultType)),
        resultType.isStreamResult(),
        options.allowCancellation
      };
    } else {
      return internalUnimplemented(
          interface.getProto().getDisplayName().cStr(), interfaceId, methodId);
    }
  } else {
    return internalUnimplemented(schema.getProto().getDisplayName().cStr(), interfaceId);
  }